

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

ModuleScope * __thiscall
capnp::compiler::Compiler::add(ModuleScope *__return_storage_ptr__,Compiler *this,Module *module)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *this_00;
  uint64_t uVar1;
  CompiledModule *pCVar2;
  
  this_00 = &this->impl;
  kj::_::Mutex::lock(&this_00->mutex,0);
  pCVar2 = Impl::addInternal((this->impl).value.ptr,module);
  if (this_00 != (MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)0x0) {
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  uVar1 = (pCVar2->rootNode).id;
  __return_storage_ptr__->compiler = this;
  __return_storage_ptr__->id = uVar1;
  __return_storage_ptr__->node = &pCVar2->rootNode;
  return __return_storage_ptr__;
}

Assistant:

Compiler::ModuleScope Compiler::add(Module& module) const {
  Node& root = impl.lockExclusive()->get()->addInternal(module).getRootNode();
  return ModuleScope(*this, root.getId(), root);
}